

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Query.cpp
# Opt level: O2

QToken * filter_qtoken(QToken *__return_storage_ptr__,QToken *token,uint32_t off,
                      TokenValidator *is_ok)

{
  uchar *puVar1;
  QToken *pQVar2;
  bool bVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar4;
  uchar *puVar5;
  uint8_t val;
  vector<unsigned_char,_std::allocator<unsigned_char>_> possible_values;
  uchar local_59;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  QToken *local_38;
  
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38 = __return_storage_ptr__;
  pvVar4 = QToken::possible_values(token);
  puVar1 = (pvVar4->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (puVar5 = (pvVar4->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_start; pQVar2 = local_38, puVar5 != puVar1;
      puVar5 = puVar5 + 1) {
    local_59 = *puVar5;
    bVar3 = std::function<bool_(unsigned_int,_unsigned_char)>::operator()(is_ok,off,local_59);
    if (bVar3) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_58,&local_59);
    }
  }
  QToken::with_values((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_58);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_58);
  return pQVar2;
}

Assistant:

QToken filter_qtoken(const QToken &token, uint32_t off,
                     const TokenValidator &is_ok) {
    std::vector<uint8_t> possible_values;
    for (uint8_t val : token.possible_values()) {
        if (is_ok(off, val)) {
            possible_values.push_back(val);
        }
    }
    return QToken::with_values(std::move(possible_values));
}